

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
TOICompactRewardDecPOMDPDiscrete::GetReward
          (TOICompactRewardDecPOMDPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indSIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indAIs)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  const_reference pvVar4;
  long lVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  TOICompactRewardDecPOMDPDiscrete *in_RSI;
  RewardModelTOISparse *in_RDI;
  double dVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrElems;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexVec;
  uint i;
  double reward;
  undefined8 in_stack_ffffffffffffff30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Index in_stack_ffffffffffffff38;
  Index in_stack_ffffffffffffff3c;
  TOICompactRewardDecPOMDPDiscrete *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  value_type vVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrElems_00;
  undefined4 in_stack_ffffffffffffff68;
  value_type in_stack_ffffffffffffff6c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_79 [2];
  undefined1 local_45 [29];
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indSIs_00;
  RewardModelTOISparse *this_02;
  
  indSIs_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  uVar9 = 0;
  this_02 = in_RDI;
  while( true ) {
    uVar2 = (ulong)uVar9;
    uVar3 = (**(code **)(*(long *)&in_RDI->_m_s_str + 0x10))();
    if (uVar2 == uVar3) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,(ulong)uVar9);
    in_stack_ffffffffffffff6c = *pvVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,(ulong)uVar9);
    dVar7 = GetIndividualReward(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                in_stack_ffffffffffffff38,
                                (Index)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    indSIs_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(dVar7 + (double)indSIs_00);
    uVar9 = uVar9 + 1;
  }
  lVar5 = (**(code **)(*(long *)&in_RDI->_m_s_str + 0x10))();
  if (lVar5 == 2) {
    dVar7 = RewardModelTOISparse::Get
                      (this_02,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,in_RDX)
    ;
    indSIs_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(dVar7 + (double)indSIs_00);
  }
  else {
    local_45._1_4_ = 0;
    nrElems_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_45;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xacb924);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffff50,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (value_type_conflict1 *)in_stack_ffffffffffffff40,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xacb952);
    local_79[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._1_8_ = (**(code **)(*(long *)&in_RDI->_m_s_str + 0x10))();
    this_01 = local_79;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xacb980);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (this_01,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (value_type_conflict2 *)in_stack_ffffffffffffff40,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xacb9a5);
    do {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_45 + 5),0);
      vVar8 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_45 + 5),1);
      if (vVar8 != *pvVar6) {
        this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_45 + 5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,1);
        in_stack_ffffffffffffff40 =
             (TOICompactRewardDecPOMDPDiscrete *)
             GetTwoAgentReward(in_RSI,(Index)((ulong)in_RDX >> 0x20),(Index)in_RDX,indSIs_00,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               CONCAT44(uVar9,in_stack_ffffffffffffffd8));
        indSIs_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((double)in_stack_ffffffffffffff40 + (double)indSIs_00);
      }
      bVar1 = IndexTools::Increment
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),nrElems_00);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40);
  }
  return (double)indSIs_00;
}

Assistant:

double TOICompactRewardDecPOMDPDiscrete::GetReward(
    const std::vector<Index> &indSIs,
    const std::vector<Index> &indAIs) const
{
    double reward=0;

    for(unsigned int i=0;i!=GetNrAgents();++i)
        reward+=GetIndividualReward(indSIs[i],indAIs[i],i);

    switch(GetNrAgents())
    {
    case 2:
        reward+=_m_p_rModel->Get(indSIs,indAIs);
        break;
    default:
    {
        vector<Index> indexVec(2,0);
        vector<size_t> nrElems(2,GetNrAgents());

        do
        {
#if 0
            if(indexVec[0]!=indexVec[1] &&
               GetTwoAgentReward(indexVec[0],indexVec[1],indSIs,indAIs)!=0)
                cout << "adding  i " << indexVec[0]
                     << " si " << indSIs[indexVec[0]] 
                     << GetIndividualMADPD(indexVec[0])->GetState(indSIs[indexVec[0]])->SoftPrint()
                     << " j " << indexVec[1] 
                     << " sj " << indSIs[indexVec[1]]
                     << GetIndividualMADPD(indexVec[1])->GetState(indSIs[indexVec[1]])->SoftPrint()
                     << " r "
                     << GetTwoAgentReward(indexVec[0],indexVec[1],
                                          indSIs,indAIs) << endl;
#endif
            if(indexVec[0]!=indexVec[1])
                reward+=GetTwoAgentReward(indexVec[0],indexVec[1],
                                          indSIs,indAIs);
        }
        while(!IndexTools::Increment(indexVec,nrElems));

#if 0
        reward2+=GetTwoAgentReward(0,1,indSIs,indAIs);
        reward2+=GetTwoAgentReward(1,0,indSIs,indAIs);

        reward2+=GetTwoAgentReward(0,2,indSIs,indAIs);
        reward2+=GetTwoAgentReward(2,0,indSIs,indAIs);

        reward2+=GetTwoAgentReward(1,2,indSIs,indAIs);
        reward2+=GetTwoAgentReward(2,1,indSIs,indAIs);
#endif
        break;
    }
    }

#if DEBUG_TOICompactRewardDecPOMDPDiscrete
    cout << "GetReward(" << sI << "," << jaI << ") = " << reward << endl;
#endif
    return(reward);
}